

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void ensureBits32(LodePNGBitReader *reader,size_t nbits)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  
  uVar1 = reader->size;
  uVar2 = reader->bp >> 3;
  bVar3 = (byte)reader->bp;
  if (uVar2 + 4 < uVar1) {
    bVar3 = bVar3 & 7;
    uVar4 = *(uint *)(reader->data + uVar2) >> bVar3;
    reader->buffer = uVar4;
    uVar4 = ((uint)reader->data[uVar2 + 4] << 0x18) << (8 - bVar3 & 0x1f) | uVar4;
  }
  else {
    reader->buffer = 0;
    uVar4 = 0;
    if (uVar2 < uVar1) {
      uVar4 = (uint)reader->data[uVar2];
      reader->buffer = (uint)reader->data[uVar2];
    }
    if (uVar2 + 1 < uVar1) {
      uVar4 = uVar4 | (uint)reader->data[uVar2 + 1] << 8;
      reader->buffer = uVar4;
    }
    if (uVar2 + 2 < uVar1) {
      uVar4 = uVar4 | (uint)reader->data[uVar2 + 2] << 0x10;
      reader->buffer = uVar4;
    }
    if (uVar2 + 3 < uVar1) {
      uVar4 = uVar4 | (uint)reader->data[uVar2 + 3] << 0x18;
    }
    uVar4 = uVar4 >> (bVar3 & 7);
  }
  reader->buffer = uVar4;
  return;
}

Assistant:

static LODEPNG_INLINE void ensureBits32(LodePNGBitReader* reader, size_t nbits) {
  size_t start = reader->bp >> 3u;
  size_t size = reader->size;
  if(start + 4u < size) {
    reader->buffer = (unsigned)reader->data[start + 0] | ((unsigned)reader->data[start + 1] << 8u) |
                     ((unsigned)reader->data[start + 2] << 16u) | ((unsigned)reader->data[start + 3] << 24u);
    reader->buffer >>= (reader->bp & 7u);
    reader->buffer |= (((unsigned)reader->data[start + 4] << 24u) << (8u - (reader->bp & 7u)));
  } else {
    reader->buffer = 0;
    if(start + 0u < size) reader->buffer |= reader->data[start + 0];
    if(start + 1u < size) reader->buffer |= ((unsigned)reader->data[start + 1] << 8u);
    if(start + 2u < size) reader->buffer |= ((unsigned)reader->data[start + 2] << 16u);
    if(start + 3u < size) reader->buffer |= ((unsigned)reader->data[start + 3] << 24u);
    reader->buffer >>= (reader->bp & 7u);
  }
  (void)nbits;
}